

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O3

Vec_Int_t * Vec_WecInsertLevel(Vec_Wec_t *p,int i)

{
  int *piVar1;
  Vec_Int_t *pVVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  
  uVar6 = p->nSize;
  if (uVar6 == p->nCap) {
    if ((int)uVar6 < 0x10) {
      if (p->pArray == (Vec_Int_t *)0x0) {
        pVVar2 = (Vec_Int_t *)malloc(0x100);
      }
      else {
        pVVar2 = (Vec_Int_t *)realloc(p->pArray,0x100);
        uVar6 = p->nCap;
      }
      p->pArray = pVVar2;
      iVar4 = 0x10 - uVar6;
      pVVar2 = pVVar2 + (int)uVar6;
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar6 * 2;
      if (p->pArray == (Vec_Int_t *)0x0) {
        pVVar2 = (Vec_Int_t *)malloc((ulong)uVar6 << 5);
      }
      else {
        pVVar2 = (Vec_Int_t *)realloc(p->pArray,(ulong)uVar6 << 5);
        uVar6 = p->nCap;
      }
      p->pArray = pVVar2;
      iVar4 = iVar5 - uVar6;
      pVVar2 = pVVar2 + (int)uVar6;
    }
    memset(pVVar2,0,(long)iVar4 << 4);
    p->nCap = iVar5;
    uVar6 = p->nSize;
  }
  p->nSize = uVar6 + 1;
  if (-1 < (int)uVar6) {
    pVVar2 = p->pArray;
    pVVar3 = pVVar2 + ((ulong)(uVar6 + 1) - 2);
    while (pVVar2 <= pVVar3) {
      iVar5 = pVVar3->nSize;
      piVar1 = pVVar3->pArray;
      pVVar3[1].nCap = pVVar3->nCap;
      pVVar3[1].nSize = iVar5;
      pVVar3[1].pArray = piVar1;
      pVVar3 = pVVar3 + -1;
      pVVar2 = p->pArray;
    }
    pVVar2->nCap = 0;
    pVVar2->nSize = 0;
    pVVar2->pArray = (int *)0x0;
    return pVVar3;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                ,0x142,"Vec_Int_t *Vec_WecInsertLevel(Vec_Wec_t *, int)");
}

Assistant:

static inline Vec_Int_t * Vec_WecInsertLevel( Vec_Wec_t * p, int i )
{
    Vec_Int_t * pTemp;
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_WecGrow( p, 16 );
        else
            Vec_WecGrow( p, 2 * p->nCap );
    }
    ++p->nSize;
    assert( i >= 0 && i < p->nSize );
    for ( pTemp = p->pArray + p->nSize - 2; pTemp >= p->pArray + i; pTemp-- )
        pTemp[1] = pTemp[0];
    Vec_IntZero( p->pArray + i );
    return p->pArray + i;
}